

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O3

int get_random_numbers(uint64_t *buffer,size_t count,uint64_t b)

{
  ulong *__ptr;
  undefined1 auVar1 [16];
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = b;
  __stream = fopen("/dev/urandom","r");
  if (__stream == (FILE *)0x0) {
    iVar2 = -1;
  }
  else {
    sVar3 = fread(buffer,8,count,__stream);
    iVar5 = (int)count - (int)sVar3;
    if (count != 0) {
      sVar4 = 0;
      do {
        __ptr = buffer + sVar4;
        while (~SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) % auVar1,0) <= *__ptr) {
          sVar3 = fread(__ptr,8,1,__stream);
          iVar5 = (iVar5 - (int)sVar3) + 1;
        }
        *__ptr = *__ptr % b;
        sVar4 = sVar4 + 1;
      } while (sVar4 != count);
    }
    iVar2 = fclose(__stream);
    iVar2 = iVar2 - iVar5;
  }
  return iVar2;
}

Assistant:

int get_random_numbers(uint64_t buffer[], size_t count, uint64_t b) {

    #if defined(__linux__) || defined(__APPLE__)

        uint64_t bad = UINT64_MAX - (UINT64_MAX % b);
        FILE* f = fopen("/dev/urandom", "r");
        if(f == NULL)
            return -1;
        int err = 0;
        err += count - fread(buffer, sizeof(uint64_t), count, f);
        for(size_t i = 0; i < count; i++) {
            while(buffer[i] >= bad) {
                err += 1 - fread(&(buffer[i]), sizeof(uint64_t), 1, f);
            }
            buffer[i] %= b;
        }
        err -= fclose(f);
        return -err;

    #elif _WIN32

        uint64_t bad = UINT64_MAX - (UINT64_MAX % b);
        HMODULE hmod = LoadLibrary("advapi32.dll");
        if(hmod == NULL)
            return -1;
        BOOLEAN (APIENTRY* RtlGenRandom_ptr)(PVOID, ULONG) = (BOOLEAN (APIENTRY*)(PVOID, ULONG)) GetProcAddress(hmod, "SystemFunction036");
        if(!RtlGenRandom_ptr) {
            FreeLibrary(hmod);
            return -1;
        }
        int err = 0;
        if(!RtlGenRandom_ptr(buffer, count * sizeof(uint64_t)))
            err++;
        for(size_t i = 0; i < count; i++) {
            while(buffer[i] >= bad) {
                if(!RtlGenRandom_ptr(&(buffer[i]), sizeof(uint64_t)))
                    err++;
            }
            buffer[i] %= b;
        }
        if(!FreeLibrary(hmod))
            err++;
        return -err;

    #endif

}